

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_sei.c
# Opt level: O1

RK_S32 decode_nal_sei_alternative_transfer(HEVCContext *s,BitReadCtx_t *gb)

{
  MPP_RET MVar1;
  RK_S32 RVar2;
  undefined8 in_RAX;
  RK_S32 _out;
  RK_S32 local_14;
  
  local_14 = (RK_S32)((ulong)in_RAX >> 0x20);
  MVar1 = mpp_read_bits(gb,8,&local_14);
  gb->ret = MVar1;
  RVar2 = -0x3ec;
  if (MVar1 == MPP_OK) {
    (s->alternative_transfer).present = 1;
    (s->alternative_transfer).preferred_transfer_characteristics = local_14;
    s->is_hdr = 1;
    RVar2 = 0;
  }
  return RVar2;
}

Assistant:

static RK_S32 decode_nal_sei_alternative_transfer(HEVCContext *s, BitReadCtx_t *gb)
{
    HEVCSEIAlternativeTransfer *alternative_transfer = &s->alternative_transfer;
    RK_S32 val;

    READ_BITS(gb, 8, &val);
    alternative_transfer->present = 1;
    alternative_transfer->preferred_transfer_characteristics = val;
    s->is_hdr = 1;
    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}